

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hyperplane_Reorderer.cpp
# Opt level: O2

string * __thiscall
mpireorderinglib::Hyperplane_Reorderer::get_name_abi_cxx11_
          (string *__return_storage_ptr__,Hyperplane_Reorderer *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

std::string mpireorderinglib::Hyperplane_Reorderer::get_name() {
  return name;
}